

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

void __thiscall
deqp::gls::AttributePack::AttributePack
          (AttributePack *this,TestContext *testCtx,RenderContext *renderCtx,Context *drawContext,
          UVec2 *screenSize,bool useVao,bool logEnabled)

{
  this->m_testCtx = testCtx;
  this->m_renderCtx = renderCtx;
  this->m_ctx = drawContext;
  (this->m_arrays).
  super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_arrays).
  super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_arrays).
  super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_program = (ShaderProgram *)0x0;
  tcu::Surface::Surface(&this->m_screen,screenSize->m_data[0],screenSize->m_data[1]);
  this->m_useVao = useVao;
  this->m_logEnabled = logEnabled;
  this->m_programID = 0;
  this->m_vaoID = 0;
  if (useVao) {
    (*this->m_ctx->_vptr_Context[0x4c])(this->m_ctx,1,&this->m_vaoID);
  }
  return;
}

Assistant:

AttributePack::AttributePack (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, sglr::Context& drawContext, const tcu::UVec2& screenSize, bool useVao, bool logEnabled)
	: m_testCtx		(testCtx)
	, m_renderCtx	(renderCtx)
	, m_ctx			(drawContext)
	, m_program		(DE_NULL)
	, m_screen		(screenSize.x(), screenSize.y())
	, m_useVao		(useVao)
	, m_logEnabled	(logEnabled)
	, m_programID	(0)
	, m_vaoID		(0)
{
	if (m_useVao)
		m_ctx.genVertexArrays(1, &m_vaoID);
}